

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsort.c
# Opt level: O2

sexp_conflict
sexp_sort_x(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict seq,sexp_conflict less,
           sexp_conflict key)

{
  sexp_uint_t sVar1;
  undefined8 uVar2;
  long lVar3;
  sexp_conflict psVar4;
  sexp *ppsVar5;
  sexp_tag_t sVar6;
  int iVar7;
  sexp psVar8;
  long lVar9;
  undefined8 uStackY_70;
  sexp_conflict vec;
  sexp_conflict scratch;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  vec = (sexp_conflict)0x43e;
  scratch = (sexp_conflict)0x43e;
  if (seq == (sexp_conflict)&DAT_0000023e) {
    return (sexp_conflict)&DAT_0000023e;
  }
  if ((sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[2].prev == seq) {
    return seq;
  }
  local_48.var = &vec;
  local_38.next = &local_48;
  local_48.next = (ctx->value).context.saves;
  local_38.var = &scratch;
  (ctx->value).context.saves = &local_38;
  lVar3 = sexp_listp_op(ctx,0,1,seq);
  psVar4 = seq;
  if (lVar3 != 0x3e) {
    psVar4 = (sexp_conflict)sexp_list_to_vector_op(ctx,0,1,seq);
  }
  vec = psVar4;
  if ((((ulong)psVar4 & 3) == 0) && (psVar4->tag == 10)) {
    scratch = (sexp_conflict)sexp_make_vector_op(ctx,0,2,(psVar4->value).stack.length * 2 + 1,0x43e)
    ;
    sVar1 = (vec->value).stack.length;
    if (key == (sexp_conflict)0x3e) {
      if (less == (sexp_conflict)0x3e) {
        sexp_merge_sort(ctx,&(vec->value).type.cpl,&(scratch->value).type.cpl,0,sVar1 - 1);
        psVar4 = vec;
        goto LAB_00101b63;
      }
      if (((ulong)less & 3) == 0) {
        sVar6 = less->tag;
        if (sVar6 == 0x1b) {
          if ((less->value).flonum_bits[0x58] == '\x05') {
            sexp_merge_sort(ctx,&(vec->value).type.cpl,&(scratch->value).type.cpl,0,sVar1 - 1);
            psVar4 = vec;
            if ((less->tag == 0x1b) && ((less->value).flonum_bits[0x5c] != '\0')) {
              iVar7 = *(int *)&vec->value;
              lVar3 = 0;
              while( true ) {
                iVar7 = iVar7 + -1;
                lVar9 = (long)iVar7;
                if (lVar9 <= lVar3) break;
                uVar2 = *(undefined8 *)((long)&vec->value + lVar3 * 8 + 8);
                *(undefined8 *)((long)&vec->value + lVar3 * 8 + 8) =
                     *(undefined8 *)((long)&vec->value + lVar9 * 8 + 8);
                *(undefined8 *)((long)&vec->value + lVar9 * 8 + 8) = uVar2;
                lVar3 = lVar3 + 1;
              }
            }
            goto LAB_00101b63;
          }
          goto LAB_00101b1a;
        }
        goto LAB_00101b1d;
      }
    }
    else if (((ulong)less & 3) == 0) {
LAB_00101b1a:
      sVar6 = less->tag;
LAB_00101b1d:
      if ((sVar6 == 0x14) || (sVar6 == 0x1b)) {
        if (((ulong)key & 3) == 0) {
          if (((key != (sexp_conflict)0x3e) && (key->tag != 0x14)) && (key->tag != 0x1b))
          goto LAB_00101b3f;
        }
        else if (key != (sexp_conflict)0x3e) {
LAB_00101b3f:
          uStackY_70 = 0x14;
          psVar4 = key;
          goto LAB_00101b5e;
        }
        psVar4 = sexp_merge_sort_less
                           (ctx,&(vec->value).type.cpl,&(scratch->value).type.cpl,0,sVar1 - 1,less,
                            key);
        if ((((ulong)psVar4 & 3) != 0) || (psVar4->tag != 0x13)) {
          psVar4 = scratch;
        }
        goto LAB_00101b63;
      }
    }
    uStackY_70 = 0x14;
    psVar4 = less;
  }
  else {
    uStackY_70 = 10;
  }
LAB_00101b5e:
  psVar4 = (sexp_conflict)sexp_type_exception(ctx,self,uStackY_70,psVar4);
LAB_00101b63:
  if (((((ulong)seq & 3) == 0) && (seq->tag == 6)) &&
     ((((ulong)psVar4 & 3) != 0 || (psVar4->tag != 0x13)))) {
    ppsVar5 = &(vec->value).type.cpl;
    for (psVar8 = seq; (psVar4 = seq, ((ulong)psVar8 & 3) == 0 && (psVar8->tag == 6));
        psVar8 = (psVar8->value).type.cpl) {
      (psVar8->value).flonum = (double)*ppsVar5;
      ppsVar5 = ppsVar5 + 1;
    }
  }
  (ctx->value).context.saves = local_48.next;
  return psVar4;
}

Assistant:

sexp sexp_sort_x (sexp ctx, sexp self, sexp_sint_t n, sexp seq,
                         sexp less, sexp key) {
  sexp_sint_t len;
  sexp res;
  sexp_gc_var2(vec, scratch);

  if (sexp_nullp(seq) || seq == sexp_global(ctx, SEXP_G_EMPTY_VECTOR))
    return seq;

  sexp_gc_preserve2(ctx, vec, scratch);

  vec = (sexp_truep(sexp_listp(ctx, seq)) ? sexp_list_to_vector(ctx, seq) : seq);

  if (! sexp_vectorp(vec)) {
    res = sexp_type_exception(ctx, self, SEXP_VECTOR, vec);
  } else {
    scratch = sexp_make_vector(ctx, sexp_make_fixnum(sexp_vector_length(vec)), SEXP_VOID);
    len = sexp_vector_length(vec);
    if (sexp_not(key) && sexp_basic_comparator(less)) {
      sexp_merge_sort(ctx, sexp_vector_data(vec), sexp_vector_data(scratch),
                      0, len-1);
      if (sexp_opcodep(less) && sexp_opcode_inverse(less))
        sexp_vector_nreverse(ctx, vec);
      res = vec;
    } else if (! (sexp_procedurep(less) || sexp_opcodep(less))) {
      res = sexp_type_exception(ctx, self, SEXP_PROCEDURE, less);
    } else if (! (sexp_procedurep(key) || sexp_opcodep(key) || sexp_not(key))) {
      res = sexp_type_exception(ctx, self, SEXP_PROCEDURE, key);
    } else {
      res = sexp_merge_sort_less(ctx, sexp_vector_data(vec),
                                 sexp_vector_data(scratch),
                                 0, len-1, less, key);
      if (!sexp_exceptionp(res))
        res = scratch;
    }
  }

  if (sexp_pairp(seq) && ! sexp_exceptionp(res))
    res = sexp_vector_copy_to_list(ctx, vec, seq);

  sexp_gc_release2(ctx);
  return res;
}